

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  pointer *this_00;
  char *pcVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> local_5a8;
  _InputArray local_588;
  allocator local_569;
  string local_568 [32];
  _InputArray local_548;
  allocator local_529;
  string local_528 [32];
  _Vector_impl local_508;
  Scalar_<double> local_4f0;
  Scalar_<double> local_4d0;
  _InputOutputArray local_4b0;
  _InputArray local_498;
  _InputArray local_480;
  Mat local_468 [8];
  Mat out;
  undefined1 local_408 [8];
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> dMatch;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPoint2;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPoint1;
  undefined1 local_3a8 [8];
  vector<Descriptor,_std::allocator<Descriptor>_> keyPointDescriptor2;
  undefined1 local_378 [8];
  vector<Descriptor,_std::allocator<Descriptor>_> keyPointDescriptor1;
  allocator local_341;
  string local_340 [32];
  Scalar_<double> local_320;
  _InputOutputArray local_300;
  _InputArray local_2e8;
  _InputArray local_2d0;
  allocator local_2b1;
  string local_2b0 [32];
  Scalar_<double> local_290;
  _InputOutputArray local_270;
  _InputArray local_258;
  Mat local_240 [8];
  Mat featurePointsImg;
  undefined1 local_1e0 [8];
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> featurePoints2;
  Mat origImage2;
  undefined1 local_168 [8];
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> featurePoints1;
  Mat origImage1;
  allocator local_e9;
  string local_e8 [6];
  bool isANMS;
  int local_c8;
  allocator local_c1;
  int useANMS;
  int local_a0;
  allocator local_99;
  int thresholdMatch;
  int local_78;
  allocator local_71;
  int thresholdFeature;
  String fileName2;
  allocator local_39;
  string local_38 [8];
  String fileName1;
  char **argv_local;
  int argc_local;
  
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = argv[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&thresholdFeature,pcVar1,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pcVar1 = argv[3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&thresholdMatch,pcVar1,&local_99);
  iVar2 = std::__cxx11::stoi((string *)&thresholdMatch,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&thresholdMatch);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar1 = argv[4];
  local_78 = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&useANMS,pcVar1,&local_c1);
  iVar2 = std::__cxx11::stoi((string *)&useANMS,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&useANMS);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pcVar1 = argv[5];
  local_a0 = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
  iVar2 = std::__cxx11::stoi((string *)local_e8,(size_t *)0x0,10);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_c8 = iVar2;
  cv::imread((string *)
             &featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,(int)local_38);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_168);
  harrisCorner((Mat *)&featurePoints1.
                       super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_168,local_78,0 < iVar2);
  cv::imread((string *)
             &featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,(int)&thresholdFeature);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_1e0);
  harrisCorner((Mat *)&featurePoints2.
                       super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_1e0,local_78,0 < iVar2);
  cv::Mat::Mat(local_240);
  cv::_InputArray::_InputArray
            (&local_258,
             (Mat *)&featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputOutputArray::_InputOutputArray(&local_270,local_240);
  cv::Scalar_<double>::all(&local_290,-1.0);
  cv::drawKeypoints(&local_258,local_168,&local_270,&local_290,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_270);
  cv::_InputArray::~_InputArray(&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"Key Points",&local_2b1);
  cv::_InputArray::_InputArray(&local_2d0,local_240);
  cv::imshow(local_2b0,&local_2d0);
  cv::_InputArray::~_InputArray(&local_2d0);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  cv::waitKey(0);
  cv::_InputArray::_InputArray
            (&local_2e8,
             (Mat *)&featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputOutputArray::_InputOutputArray(&local_300,local_240);
  cv::Scalar_<double>::all(&local_320,-1.0);
  cv::drawKeypoints(&local_2e8,local_1e0,&local_300,&local_320,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_300);
  cv::_InputArray::~_InputArray(&local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"Key Points",&local_341);
  cv::_InputArray::_InputArray
            ((_InputArray *)
             &keyPointDescriptor1.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_240);
  cv::imshow(local_340,
             (_InputArray *)
             &keyPointDescriptor1.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputArray::~_InputArray
            ((_InputArray *)
             &keyPointDescriptor1.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  cv::waitKey(0);
  std::vector<Descriptor,_std::allocator<Descriptor>_>::vector
            ((vector<Descriptor,_std::allocator<Descriptor>_> *)local_378);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)
             &keyPointDescriptor2.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_168);
  generateDescriptor((Mat *)&featurePoints1.
                             super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,
                     (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)
                     &keyPointDescriptor2.
                      super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<Descriptor,_std::allocator<Descriptor>_> *)local_378);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)
             &keyPointDescriptor2.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Descriptor,_std::allocator<Descriptor>_>::vector
            ((vector<Descriptor,_std::allocator<Descriptor>_> *)local_3a8);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)
             &keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_1e0);
  generateDescriptor((Mat *)&featurePoints2.
                             super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,
                     (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)
                     &keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<Descriptor,_std::allocator<Descriptor>_> *)local_3a8);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)
             &keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this = &keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)this);
  this_00 = &dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)this_00);
  std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::vector
            ((vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)local_408);
  findMatch((vector<Descriptor,_std::allocator<Descriptor>_> *)local_378,
            (vector<Descriptor,_std::allocator<Descriptor>_> *)local_3a8,
            (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)this,
            (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)this_00,
            (vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)local_408,local_a0);
  cv::Mat::Mat(local_468);
  cv::_InputArray::_InputArray
            (&local_480,
             (Mat *)&featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputArray::_InputArray
            (&local_498,
             (Mat *)&featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputOutputArray::_InputOutputArray(&local_4b0,local_468);
  cv::Scalar_<double>::all(&local_4d0,-1.0);
  cv::Scalar_<double>::all(&local_4f0,-1.0);
  local_508.super__Tp_alloc_type = (_Tp_alloc_type)0x0;
  local_508._1_7_ = 0;
  local_508._8_8_ = 0;
  local_508._16_8_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_508);
  cv::drawMatches(&local_480,
                  &keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,&local_498,
                  &dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,local_408,&local_4b0,&local_4d0,
                  &local_4f0,&local_508,0);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&local_508);
  cv::_InputOutputArray::~_InputOutputArray(&local_4b0);
  cv::_InputArray::~_InputArray(&local_498);
  cv::_InputArray::~_InputArray(&local_480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"Match",&local_529);
  cv::_InputArray::_InputArray(&local_548,local_468);
  cv::imshow(local_528,&local_548);
  cv::_InputArray::~_InputArray(&local_548);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  cv::waitKey(0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"screenshot.png",&local_569);
  cv::_InputArray::_InputArray(&local_588,local_468);
  local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_5a8);
  cv::imwrite(local_568,&local_588,(vector *)&local_5a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_5a8);
  cv::_InputArray::~_InputArray(&local_588);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  cv::Mat::~Mat(local_468);
  std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::~vector
            ((vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)local_408);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)
             &dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)
             &keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Descriptor,_std::allocator<Descriptor>_>::~vector
            ((vector<Descriptor,_std::allocator<Descriptor>_> *)local_3a8);
  std::vector<Descriptor,_std::allocator<Descriptor>_>::~vector
            ((vector<Descriptor,_std::allocator<Descriptor>_> *)local_378);
  cv::Mat::~Mat(local_240);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_1e0);
  cv::Mat::~Mat((Mat *)&featurePoints2.
                        super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_168);
  cv::Mat::~Mat((Mat *)&featurePoints1.
                        super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&thresholdFeature);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

	String fileName1 = argv[1];
	String fileName2 = argv[2];
	int thresholdFeature = stoi(argv[3]);
	int thresholdMatch = stoi(argv[4]);
	int useANMS = stoi(argv[5]);
	bool isANMS = (useANMS > 0) ? true : false;

	Mat origImage1 = imread(fileName1);
	vector<KeyPoint> featurePoints1;
	harrisCorner(origImage1, featurePoints1, thresholdFeature,isANMS);

	Mat origImage2 = imread(fileName2);
	vector<KeyPoint> featurePoints2;
	harrisCorner(origImage2, featurePoints2, thresholdFeature,isANMS);

	Mat featurePointsImg;
	drawKeypoints(origImage1, featurePoints1, featurePointsImg);
	imshow("Key Points", featurePointsImg);
	waitKey();

	drawKeypoints(origImage2, featurePoints2, featurePointsImg);
	imshow("Key Points", featurePointsImg);
	waitKey();

	vector<Descriptor> keyPointDescriptor1;
	generateDescriptor(origImage1, featurePoints1, keyPointDescriptor1);

	vector<Descriptor> keyPointDescriptor2;
	generateDescriptor(origImage2, featurePoints2, keyPointDescriptor2);

	vector<KeyPoint> keyPoint1;
	vector<KeyPoint> keyPoint2;
	vector<DMatch> dMatch;
	findMatch(keyPointDescriptor1, keyPointDescriptor2, keyPoint1, keyPoint2, dMatch, thresholdMatch);

	Mat out;
	drawMatches(origImage1, keyPoint1, origImage2, keyPoint2, dMatch,out);
	imshow("Match", out);
	waitKey();
	imwrite("screenshot.png", out);

}